

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.h
# Opt level: O2

void bandit::describe(char *desc,voidfunc_t *func)

{
  listener *listener;
  contextstack_t *context_stack;
  function<void_()> local_30;
  
  std::function<void_()>::function(&local_30,func);
  listener = detail::registered_listener(bandit::detail::listener*)::reporter_;
  context_stack = detail::context_stack();
  describe(desc,&local_30,listener,context_stack,false);
  std::_Function_base::~_Function_base(&local_30.super__Function_base);
  return;
}

Assistant:

inline void describe(const char* desc, detail::voidfunc_t func)
  {
    describe(desc, func, detail::registered_listener(), detail::context_stack());
  }